

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_page_manager.h
# Opt level: O2

Region * __thiscall
density::detail::SystemPageManager<65536UL>::get_next_region
          (SystemPageManager<65536UL> *this,progress_guarantee i_progress_guarantee,
          Region *i_curr_region,Region **io_new_region)

{
  __pointer_type __p2;
  bool bVar1;
  Region *pRVar2;
  __pointer_type next_region;
  
  next_region = (i_curr_region->m_next_region)._M_b._M_p;
  if (next_region == (__pointer_type)0x0) {
    if (i_progress_guarantee != progress_blocking) {
      return (Region *)0x0;
    }
    pRVar2 = *io_new_region;
    if (pRVar2 == (Region *)0x0) {
      pRVar2 = create_region();
      *io_new_region = pRVar2;
      if (pRVar2 == (Region *)0x0) {
        next_region = (i_curr_region->m_next_region)._M_b._M_p;
        if (next_region == (__pointer_type)0x0) {
          return (Region *)0x0;
        }
        goto LAB_00e62c38;
      }
    }
    __p2 = *io_new_region;
    __p2->m_cumulative_available_memory =
         (pRVar2->m_end - (pRVar2->m_curr).super___atomic_base<unsigned_long>._M_i) +
         i_curr_region->m_cumulative_available_memory;
    bVar1 = std::atomic<density::detail::SystemPageManager<65536UL>::Region_*>::
            compare_exchange_strong
                      (&i_curr_region->m_next_region,&next_region,__p2,memory_order_seq_cst);
    if (bVar1) {
      next_region = *io_new_region;
      *io_new_region = (Region *)0x0;
    }
  }
LAB_00e62c38:
  LOCK();
  if (i_curr_region == (this->m_curr_region)._M_b._M_p) {
    (this->m_curr_region)._M_b._M_p = next_region;
  }
  UNLOCK();
  return next_region;
}

Assistant:

Region * get_next_region(
              progress_guarantee i_progress_guarantee,
              Region *           i_curr_region,
              Region **          io_new_region) noexcept
            {
                // we get the pointer to the next_region region, or allocate it
                auto next_region = i_curr_region->m_next_region.load();
                if (next_region == nullptr)
                {
                    // check if the user want to allocate memory from the system
                    if (i_progress_guarantee != progress_blocking)
                    {
                        return nullptr;
                    }

                    // allocate a new region, if we don't have one already
                    if (*io_new_region == nullptr)
                    {
                        *io_new_region = create_region();
                    }

                    if (*io_new_region != nullptr)
                    {
                        // set m_cumulative_available_memory on the new region
                        auto const new_region_size =
                          (*io_new_region)->m_end - (*io_new_region)->m_curr;
                        DENSITY_ASSUME_UINT_ALIGNED(new_region_size, page_alignment_and_size);
                        (*io_new_region)->m_cumulative_available_memory =
                          i_curr_region->m_cumulative_available_memory + new_region_size;

                        // The allocation succeeded, so set the pointer to the next_region region, if it is null
                        if (i_curr_region->m_next_region.compare_exchange_strong(
                              next_region, *io_new_region))
                        {
                            next_region    = *io_new_region;
                            *io_new_region = nullptr;
                        }
                    }
                    else
                    {
                        /* We couldn't allocate a new region, check if someone else could in the meanwhile.
                            If not, we give in. Else we continue the loop. */
                        next_region = i_curr_region->m_next_region.load();
                        if (next_region == nullptr)
                        {
                            // allocation failed
                            return nullptr;
                        }
                    }
                }

                /* try to update m_curr_region (if m_curr_region == i_curr_region, then m_curr_region = next_region).
                    This operation is not mandatory, so we can tolerate spurious failures. */
                DENSITY_ASSUME(next_region != nullptr);
                auto expected = i_curr_region;
                m_curr_region.compare_exchange_weak(
                  expected, next_region, std::memory_order_release, std::memory_order_relaxed);

                // we are done we this region
                i_curr_region = next_region;

                return i_curr_region;
            }